

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

wchar_t archive_read_format_cab_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  wchar_t wVar1;
  int64_t iVar2;
  size_t *in_RCX;
  void **in_RDX;
  archive_read *in_RSI;
  archive *in_RDI;
  wchar_t r;
  cab *cab;
  size_t *offset_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  offset_00 = *(size_t **)in_RDI[0x15].archive_format_name;
  if (*(ushort *)(offset_00[6] + 0x10) - 0xfffd < 3) {
    (in_RSI->archive).magic = 0;
    (in_RSI->archive).state = 0;
    *in_RDX = (void *)0x0;
    *in_RCX = 0;
    archive_clear_error(in_RDI);
    archive_set_error(in_RDI,0x54,"Cannot restore this file split in multivolume.");
    return L'\xffffffe7';
  }
  if (*(char *)((long)offset_00 + 0x94) == '\0') {
    if (offset_00[0x13] != 0) {
      if ((offset_00[7] == 0) &&
         (wVar1 = cab_next_cfdata((archive_read *)
                                  CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)),
         wVar1 < L'\0')) {
        return wVar1;
      }
      iVar2 = cab_consume_cfdata((archive_read *)
                                 CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                 (int64_t)in_RDI);
      if (iVar2 < 0) {
        return L'\xffffffe2';
      }
      offset_00[0x13] = 0;
    }
    *(undefined1 *)((long)offset_00 + 0x94) = 1;
  }
  if (offset_00[2] != 0) {
    iVar2 = cab_consume_cfdata((archive_read *)
                               CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                               (int64_t)in_RDI);
    offset_00[2] = 0;
    if ((wchar_t)iVar2 < L'\0') {
      return (wchar_t)iVar2;
    }
  }
  if ((*(char *)((long)offset_00 + 0x91) == '\0') && (*(char *)((long)offset_00 + 0x92) == '\0')) {
    wVar1 = cab_read_data(in_RSI,in_RDX,in_RCX,(int64_t *)offset_00);
  }
  else {
    if (*(char *)((long)offset_00 + 0x93) == '\0') {
      *(undefined1 *)((long)offset_00 + 0x93) = 1;
    }
    *in_RCX = *offset_00;
    *in_RDX = (void *)0x0;
    (in_RSI->archive).magic = 0;
    (in_RSI->archive).state = 0;
    wVar1 = L'\x01';
  }
  return wVar1;
}

Assistant:

static int
archive_read_format_cab_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	struct cab *cab = (struct cab *)(a->format->data);
	int r;

	switch (cab->entry_cffile->folder) {
	case iFoldCONTINUED_FROM_PREV:
	case iFoldCONTINUED_TO_NEXT:
	case iFoldCONTINUED_PREV_AND_NEXT:
		*buff = NULL;
		*size = 0;
		*offset = 0;
		archive_clear_error(&a->archive);
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Cannot restore this file split in multivolume.");
		return (ARCHIVE_FAILED);
	default:
		break;
	}
	if (cab->read_data_invoked == 0) {
		if (cab->bytes_skipped) {
			if (cab->entry_cfdata == NULL) {
				r = cab_next_cfdata(a);
				if (r < 0)
					return (r);
			}
			if (cab_consume_cfdata(a, cab->bytes_skipped) < 0)
				return (ARCHIVE_FATAL);
			cab->bytes_skipped = 0;
		}
		cab->read_data_invoked = 1;
	}
	if (cab->entry_unconsumed) {
		/* Consume as much as the compressor actually used. */
		r = (int)cab_consume_cfdata(a, cab->entry_unconsumed);
		cab->entry_unconsumed = 0;
		if (r < 0)
			return (r);
	}
	if (cab->end_of_archive || cab->end_of_entry) {
		if (!cab->end_of_entry_cleanup) {
			/* End-of-entry cleanup done. */
			cab->end_of_entry_cleanup = 1;
		}
		*offset = cab->entry_offset;
		*size = 0;
		*buff = NULL;
		return (ARCHIVE_EOF);
	}

	return (cab_read_data(a, buff, size, offset));
}